

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O0

void __thiscall Centaurus::Context<char>::parse(Context<char> *this,char *input_path,int worker_num)

{
  bool bVar1;
  int master_pid;
  Stage1Runner *this_00;
  Stage3Runner *pSVar2;
  reference ppBVar3;
  BaseRunner *p_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> *__range2_2;
  BaseRunner *p_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> *__range2_1;
  BaseRunner *p;
  iterator __end2;
  iterator __begin2;
  vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> *__range2;
  Stage3Runner *local_78;
  Stage3Runner *st3;
  Stage3Runner *local_68;
  Stage2Runner *st2;
  int i;
  Stage1Runner *local_50;
  undefined1 local_48 [8];
  vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> runners;
  ParseContext<char> context;
  int pid;
  int worker_num_local;
  char *input_path_local;
  Context<char> *this_local;
  
  master_pid = get_current_pid();
  ParseContext<char>::ParseContext
            ((ParseContext<char> *)
             &runners.
              super__Vector_base<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&this->m_callbacks,(void *)0x0);
  std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>::vector
            ((vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> *)local_48);
  this_00 = (Stage1Runner *)operator_new(0x280);
  Stage1Runner::Stage1Runner
            (this_00,input_path,&(this->m_parser).super_IParser,0x800000,worker_num * 2,false,false)
  ;
  local_50 = this_00;
  std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>::push_back
            ((vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> *)local_48,
             (value_type *)&local_50);
  for (st2._0_4_ = 0; (int)st2 < worker_num; st2._0_4_ = (int)st2 + 1) {
    pSVar2 = (Stage3Runner *)operator_new(0x270);
    Stage2Runner::Stage2Runner
              ((Stage2Runner *)pSVar2,input_path,0x800000,worker_num * 2,master_pid,
               &runners.
                super__Vector_base<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(atomic<int> *)0x0);
    local_68 = pSVar2;
    NonRecursiveReductionRunner::register_listener((NonRecursiveReductionRunner *)pSVar2,callback);
    st3 = local_68;
    std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>::push_back
              ((vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> *)local_48
               ,(value_type *)&st3);
  }
  pSVar2 = (Stage3Runner *)operator_new(0x280);
  Stage3Runner::Stage3Runner
            (pSVar2,input_path,0x800000,worker_num * 2,master_pid,
             &runners.
              super__Vector_base<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(atomic<int> *)0x0);
  local_78 = pSVar2;
  NonRecursiveReductionRunner::register_listener((NonRecursiveReductionRunner *)pSVar2,callback);
  __range2 = (vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> *)local_78;
  std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>::push_back
            ((vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> *)local_48,
             (value_type *)&__range2);
  BaseRunner::get_input((BaseRunner *)local_78);
  __end2 = std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>::begin
                     ((vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> *)
                      local_48);
  p = (BaseRunner *)
      std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>::end
                ((vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> *)
                 local_48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Centaurus::BaseRunner_**,_std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>_>
                                *)&p);
    if (!bVar1) break;
    ppBVar3 = __gnu_cxx::
              __normal_iterator<Centaurus::BaseRunner_**,_std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>_>
              ::operator*(&__end2);
    (*((*ppBVar3)->super_BaseListener)._vptr_BaseListener[5])();
    __gnu_cxx::
    __normal_iterator<Centaurus::BaseRunner_**,_std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>::begin
                       ((vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> *
                        )local_48);
  p_1 = (BaseRunner *)
        std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>::end
                  ((vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> *)
                   local_48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<Centaurus::BaseRunner_**,_std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>_>
                        *)&p_1);
    if (!bVar1) break;
    ppBVar3 = __gnu_cxx::
              __normal_iterator<Centaurus::BaseRunner_**,_std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>_>
              ::operator*(&__end2_1);
    (*((*ppBVar3)->super_BaseListener)._vptr_BaseListener[6])();
    __gnu_cxx::
    __normal_iterator<Centaurus::BaseRunner_**,_std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>_>
    ::operator++(&__end2_1);
  }
  __end2_2 = std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>::begin
                       ((vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> *
                        )local_48);
  p_2 = (BaseRunner *)
        std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>::end
                  ((vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> *)
                   local_48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<Centaurus::BaseRunner_**,_std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>_>
                        *)&p_2);
    if (!bVar1) break;
    ppBVar3 = __gnu_cxx::
              __normal_iterator<Centaurus::BaseRunner_**,_std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>_>
              ::operator*(&__end2_2);
    if (*ppBVar3 != (BaseRunner *)0x0) {
      (*((*ppBVar3)->super_BaseListener)._vptr_BaseListener[1])();
    }
    __gnu_cxx::
    __normal_iterator<Centaurus::BaseRunner_**,_std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>_>
    ::operator++(&__end2_2);
  }
  std::vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_>::~vector
            ((vector<Centaurus::BaseRunner_*,_std::allocator<Centaurus::BaseRunner_*>_> *)local_48);
  return;
}

Assistant:

void parse(const char *input_path, int worker_num)
    {
        int pid = get_current_pid();

        ParseContext<TCHAR> context{m_callbacks, nullptr};

        std::vector<BaseRunner *> runners;
        runners.push_back(new Stage1Runner{ input_path, &m_parser, 8 * 1024 * 1024, worker_num * 2 });
        for (int i = 0; i < worker_num; i++)
        {
            Stage2Runner *st2 = new Stage2Runner{input_path, 8 * 1024 * 1024, worker_num * 2, pid, static_cast<void *>(&context) };

            st2->register_listener(callback);

            runners.push_back(st2);
        }
        Stage3Runner *st3 = new Stage3Runner{ input_path, 8 * 1024 * 1024, worker_num * 2, pid, static_cast<void *>(&context) };

        st3->register_listener(callback);

        runners.push_back(st3);

        context.m_window = st3->get_input();

        for (auto p : runners)
        {
            p->start();
        }
        for (auto p : runners)
        {
            p->wait();
        }
        for (auto p : runners)
        {
            delete p;
        }
    }